

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_edge_iterator.cc
# Opt level: O1

string * __thiscall
s2shapeutil::EdgeIterator::DebugString_abi_cxx11_(string *__return_storage_ptr__,EdgeIterator *this)

{
  size_type in_RCX;
  initializer_list<absl::string_view> pieces;
  string_view local_170 [3];
  AlphaNum local_140;
  string_view local_110 [3];
  AlphaNum local_e0;
  string_view local_b0 [3];
  char *local_80;
  size_type sStack_78;
  char *local_70;
  size_type sStack_68;
  char *local_60;
  size_type sStack_58;
  char *local_50;
  size_type sStack_48;
  char *local_40;
  size_type sStack_38;
  
  absl::string_view::string_view(local_b0,"(shape=");
  absl::AlphaNum::AlphaNum(&local_e0,this->shape_id_);
  absl::string_view::string_view(local_110,", edge=");
  absl::AlphaNum::AlphaNum(&local_140,this->edge_id_);
  absl::string_view::string_view(local_170,")");
  local_80 = local_b0[0].ptr_;
  sStack_78 = local_b0[0].length_;
  local_70 = local_e0.piece_.ptr_;
  sStack_68 = local_e0.piece_.length_;
  local_60 = local_110[0].ptr_;
  sStack_58 = local_110[0].length_;
  local_50 = local_140.piece_.ptr_;
  sStack_48 = local_140.piece_.length_;
  local_40 = local_170[0].ptr_;
  sStack_38 = local_170[0].length_;
  pieces._M_len = in_RCX;
  pieces._M_array = (iterator)0x5;
  absl::strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_80,pieces);
  return __return_storage_ptr__;
}

Assistant:

string EdgeIterator::DebugString() const {
  return absl::StrCat("(shape=", shape_id_, ", edge=", edge_id_, ")");
}